

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkUniquenessAndLinearity
               (TestLog *log,vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  ostringstream *poVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(values->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2);
  if ((int)uVar5 < 1) {
    uVar10 = 0;
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = 0xffffffff;
    uVar6 = 0;
    uVar10 = 0;
    do {
      uVar2 = puVar3[uVar6];
      uVar7 = uVar9;
      if (uVar2 < uVar9) {
        uVar7 = uVar2;
      }
      uVar4 = uVar2;
      if (uVar2 < uVar10) {
        uVar4 = uVar10;
      }
      if (uVar2 == 0xffffffff) {
        uVar4 = uVar10;
        uVar7 = uVar9;
      }
      uVar9 = uVar7;
      uVar10 = uVar4;
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1c8,(ulong)((uVar10 - uVar9) + 1),(value_type_conflict4 *)local_1b0);
  puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(values->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      uVar10 = puVar3[uVar6];
      if (uVar10 != 0xffffffff) {
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10 - uVar9] =
             local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10 - uVar9] + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  if ((int)((ulong)((long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2) < 1) {
    iVar8 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar11 = 0;
    iVar8 = 0;
    do {
      if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] != 1) {
        if (iVar8 < 0x14) {
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," is not unique. Returned ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," times.",7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
        }
        iVar8 = iVar8 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)local_1c8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1c8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  if (0x14 < iVar8) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Number of values not unique: ",0x1d);
    std::ostream::operator<<(poVar1,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,", displaying first 20 values.",0x1d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar8 == 0;
}

Assistant:

bool AtomicCounterTest::checkUniquenessAndLinearity (TestLog& log, const vector<deUint32>& values)
{
	vector<deUint32>	counts;
	int					failedCount	= 0;
	deUint32			minValue	= (deUint32)-1;
	deUint32			maxValue	= 0;

	DE_ASSERT(!values.empty());

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
		{
			minValue = std::min(minValue, values[valueNdx]);
			maxValue = std::max(maxValue, values[valueNdx]);
		}
	}

	counts.resize(maxValue - minValue + 1, 0);

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
			counts[values[valueNdx] - minValue]++;
	}

	for (int countNdx = 0; countNdx < (int)counts.size(); countNdx++)
	{
		if (counts[countNdx] != 1)
		{
			if (failedCount < 20)
				log << TestLog::Message << "Value " << (minValue + countNdx) << " is not unique. Returned " << counts[countNdx] << " times." << TestLog::EndMessage;

			failedCount++;
		}
	}

	if (failedCount > 20)
		log << TestLog::Message << "Number of values not unique: " << failedCount << ", displaying first 20 values." << TestLog::EndMessage;

	return failedCount == 0;
}